

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeStiffnessMatrix(ChElementHexaCorot_8 *this)

{
  undefined1 auVar1 [16];
  DenseStorage<double,__1,__1,__1,_1> *this_00;
  pointer ppCVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double Jdet;
  MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *local_c8;
  double local_c0;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_b8;
  ChMatrixDynamic<> BT;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_88;
  ChMatrixDynamic<> *local_70 [8];
  
  this_00 = (DenseStorage<double,__1,__1,__1,_1> *)
            Eigen::internal::conditional_aligned_malloc<false>(0x18);
  BT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage._0_16_ =
       ZEXT816(0) << 0x40;
  this_00->m_cols = 0;
  uVar3 = 0;
  this_00->m_data =
       (double *)
       BT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
  this_00->m_rows =
       BT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
  local_c8 = (MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->StiffnessMatrix;
  BT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  this->Volume = 0.0;
  ppCVar2 = (this->GpVector).
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (uVar3 < (ulong)((long)(this->GpVector).
                               super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3)) {
    (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xe])(this,ppCVar2[uVar3],&Jdet);
    local_70[0] = (this->GpVector).
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3]->MatrB;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&BT,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_70);
    local_c0 = Jdet * (this->GpVector).
                      super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar3]->m_weight;
    local_b8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&BT,
                          (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                          &((this->Material).
                            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->StressStrainMatrix);
    Eigen::
    Product<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
    ::Product(&local_88,&local_b8,
              (this->GpVector).
              super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3]->MatrB);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                      *)local_70,&local_c0,(StorageBaseType *)&local_88);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>const>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)this_00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                *)local_70);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
              (local_c8,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this_00);
    ppCVar2 = (this->GpVector).
              super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = Jdet;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = ppCVar2[uVar3]->m_weight;
    uVar3 = (ulong)((int)uVar3 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->Volume;
    auVar1 = vfmadd213sd_fma(auVar5,auVar4,auVar1);
    this->Volume = auVar1._0_8_;
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage(this_00);
  free(this_00);
  Eigen::internal::handmade_aligned_free
            (BT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementHexaCorot_8::ComputeStiffnessMatrix() {
    double Jdet;
    ChMatrixDynamic<>* temp = new ChMatrixDynamic<>;
    ChMatrixDynamic<> BT;
    this->Volume = 0;

    for (unsigned int i = 0; i < GpVector.size(); i++) {
        ComputeMatrB(GpVector[i], Jdet);
        BT = GpVector[i]->MatrB->transpose();
        *temp = (Jdet * GpVector[i]->GetWeight()) * (BT * Material->Get_StressStrainMatrix() * *(GpVector[i]->MatrB));
        StiffnessMatrix += *temp;

        // by the way also computes volume:
        this->Volume += GpVector[i]->GetWeight() * Jdet;
    }

    delete temp;
}